

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O3

ostream * operator<<(ostream *os,BitString *o)

{
  long lVar1;
  char cVar2;
  ostream *poVar3;
  ulong uVar4;
  long local_1d0;
  ostringstream osTmp;
  undefined8 uStack_1c0;
  uint auStack_1b8 [22];
  ios_base local_160 [112];
  char acStack_f0 [152];
  char *local_58;
  long local_50;
  char local_48 [16];
  ostream *local_38;
  
  local_38 = os;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0);
  if ((o->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (o->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      if ((uVar4 != 0) && ((uVar4 / 5 & 0xfffffffffffffff0) * 5 == uVar4)) {
        cVar2 = (char)(ostringstream *)&local_1d0;
        std::ios::widen((char)*(undefined8 *)(local_1d0 + -0x18) + cVar2);
        std::ostream::put(cVar2);
        std::ostream::flush();
      }
      lVar1 = *(long *)(local_1d0 + -0x18);
      if (acStack_f0[lVar1 + 1] == '\0') {
        std::ios::widen((char)&local_1d0 + (char)lVar1);
        acStack_f0[lVar1 + 1] = '\x01';
      }
      acStack_f0[lVar1] = '0';
      *(undefined8 *)((long)&uStack_1c0 + *(long *)(local_1d0 + -0x18)) = 2;
      *(uint *)((long)auStack_1b8 + *(long *)(local_1d0 + -0x18)) =
           *(uint *)((long)auStack_1b8 + *(long *)(local_1d0 + -0x18)) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1d0);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)(o->value).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(o->value).
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start));
  }
  std::__cxx11::stringbuf::str();
  poVar3 = local_38;
  std::__ostream_insert<char,std::char_traits<char>>(local_38,local_58,local_50);
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0);
  std::ios_base::~ios_base(local_160);
  return poVar3;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const BitString& o)
	{
		const unsigned long linelength = 80;
		const unsigned char* pData = &o.value[0];
		std::ostringstream osTmp;

		for (size_t pos = 0; pos < o.value.size(); ++pos)
		{
            if (pos > 0 && (pos % linelength) == 0)
                osTmp << std::endl;

            // This is done byte by byte
			osTmp << std::setfill('0') << std::setw(2) << std::hex << (unsigned short)pData[pos];
		}

        os << osTmp.str();
		return os;
	}